

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::FileReadStream,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          FileReadStream *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char cVar1;
  char cVar2;
  byte *pbVar3;
  size_t sVar4;
  Ch *pCVar5;
  bool bVar6;
  int iVar7;
  byte bVar8;
  bool bVar9;
  ulong uVar10;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar11;
  uint16_t uVar12;
  Ch c;
  byte *pbVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  Ch c_5;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  
  pbVar13 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
  cVar1 = *is->current_;
  if (cVar1 == '-') {
    FileReadStream::Read(is);
  }
  bVar8 = *is->current_;
  if (bVar8 == 0x30) {
    FileReadStream::Read(is);
    iVar15 = 0;
    bVar9 = false;
    uVar16 = 0;
    uVar19 = 0;
  }
  else {
    if (8 < (byte)(bVar8 - 0x31)) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                      ,0x5fd,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pbVar13 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
      *(undefined4 *)(this + 0x30) = 3;
      goto LAB_00214b9a;
    }
    FileReadStream::Read(is);
    uVar19 = (ulong)(bVar8 - 0x30);
    bVar8 = *is->current_;
    if (cVar1 == '-') {
      if ((byte)(bVar8 - 0x30) < 10) {
        iVar15 = 0;
        do {
          uVar17 = (uint)uVar19;
          if ((0xccccccb < uVar17) && (uVar16 = uVar19, '8' < (char)bVar8 || uVar17 != 0xccccccc))
          goto LAB_00214494;
          FileReadStream::Read(is);
          uVar19 = (ulong)((uVar17 * 10 + (uint)bVar8) - 0x30);
          iVar15 = iVar15 + 1;
          bVar8 = *is->current_;
        } while ((byte)(bVar8 - 0x30) < 10);
      }
      else {
LAB_002144d0:
        iVar15 = 0;
      }
    }
    else {
      if (9 < (byte)(bVar8 - 0x30)) goto LAB_002144d0;
      iVar15 = 0;
      do {
        uVar17 = (uint)uVar19;
        if ((0x19999998 < uVar17) && (uVar16 = uVar19, '5' < (char)bVar8 || uVar17 != 0x19999999))
        goto LAB_00214494;
        FileReadStream::Read(is);
        uVar19 = (ulong)((uVar17 * 10 + (uint)bVar8) - 0x30);
        iVar15 = iVar15 + 1;
        bVar8 = *is->current_;
      } while ((byte)(bVar8 - 0x30) < 10);
    }
    bVar9 = false;
    uVar16 = 0;
  }
LAB_002144d7:
  dVar24 = 0.0;
  if (bVar9) {
    uVar10 = (ulong)(byte)*is->current_;
    bVar8 = *is->current_ - 0x30;
    if (cVar1 != '-') {
      if (bVar8 < 10) {
        do {
          if ((0x1999999999999998 < uVar16) && (uVar16 != 0x1999999999999999 || '5' < (char)uVar10))
          goto LAB_002145bc;
          FileReadStream::Read(is);
          uVar16 = (uVar10 & 0xf) + uVar16 * 10;
          iVar15 = iVar15 + 1;
          uVar10 = (ulong)(byte)*is->current_;
        } while ((byte)(*is->current_ - 0x30U) < 10);
        goto LAB_002145e5;
      }
      goto LAB_002145e1;
    }
    if (9 < bVar8) goto LAB_002145e1;
    do {
      if ((0xccccccccccccccb < uVar16) && (uVar16 != 0xccccccccccccccc || '8' < (char)uVar10))
      goto LAB_002145bc;
      FileReadStream::Read(is);
      uVar16 = (uVar10 & 0xf) + uVar16 * 10;
      iVar15 = iVar15 + 1;
      uVar10 = (ulong)(byte)*is->current_;
    } while ((byte)(*is->current_ - 0x30U) < 10);
LAB_002145e5:
    dVar24 = 0.0;
    bVar6 = false;
  }
  else {
LAB_002145e1:
    bVar6 = false;
  }
LAB_002145f1:
  if (bVar6) {
    bVar8 = *is->current_;
    while ((byte)(bVar8 - 0x30) < 10) {
      FileReadStream::Read(is);
      dVar24 = dVar24 * 10.0 + (double)(int)(bVar8 - 0x30);
      bVar8 = *is->current_;
    }
  }
  if (*is->current_ == '.') {
    FileReadStream::Read(is);
    if ((byte)(*is->current_ - 0x3aU) < 0xf6) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                      ,0x628,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pbVar13 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
      *(undefined4 *)(this + 0x30) = 0xe;
      goto LAB_00214b9a;
    }
    iVar18 = 0;
    if (!bVar6) {
      if (!bVar9) {
        uVar16 = uVar19;
      }
      bVar8 = *is->current_;
      iVar18 = 0;
      if ((0xf5 < (byte)(bVar8 - 0x3a)) && (uVar16 < 0x20000000000000)) {
        iVar18 = 0;
        do {
          FileReadStream::Read(is);
          iVar18 = iVar18 + -1;
          uVar16 = (ulong)(bVar8 & 0xf) + uVar16 * 10;
          iVar15 = (uint)(uVar16 != 0) + iVar15;
          bVar8 = *is->current_;
          if ((byte)(bVar8 - 0x3a) < 0xf6) break;
        } while (uVar16 < 0x20000000000000);
      }
      auVar22._8_4_ = (int)(uVar16 >> 0x20);
      auVar22._0_8_ = uVar16;
      auVar22._12_4_ = 0x45300000;
      dVar24 = (auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar8 = *is->current_;
    while ((byte)(bVar8 - 0x30) < 10) {
      FileReadStream::Read(is);
      if (iVar15 < 0x11) {
        dVar24 = dVar24 * 10.0 + (double)(int)(bVar8 - 0x30);
        iVar18 = iVar18 + -1;
        if (0.0 < dVar24) {
          iVar15 = iVar15 + 1;
        }
      }
      bVar8 = *is->current_;
    }
  }
  else {
    iVar18 = 0;
  }
  if ((*is->current_ == 'e') || (*is->current_ == 'E')) {
    FileReadStream::Read(is);
    uVar10 = uVar19;
    if (bVar9) {
      uVar10 = uVar16;
    }
    if (!bVar6) {
      auVar23._8_4_ = (int)(uVar10 >> 0x20);
      auVar23._0_8_ = uVar10;
      auVar23._12_4_ = 0x45300000;
      dVar24 = (auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
      bVar6 = true;
    }
    if (*is->current_ == '+') {
      bVar20 = false;
LAB_002147fb:
      FileReadStream::Read(is);
    }
    else {
      bVar20 = *is->current_ == '-';
      if (bVar20) goto LAB_002147fb;
    }
    pbVar3 = (byte *)is->current_;
    bVar8 = *pbVar3;
    if ((byte)(bVar8 - 0x30) < 10) {
      FileReadStream::Read(is);
      iVar15 = bVar8 - 0x30;
      if (bVar20) {
        if (0 < iVar18) {
          __assert_fail("expFrac <= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                        ,0x668,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        bVar8 = *is->current_;
        while ((byte)(bVar8 - 0x30) < 10) {
          FileReadStream::Read(is);
          iVar15 = iVar15 * 10 + (uint)bVar8 + -0x30;
          if ((iVar18 + 0x7ffffff7) / 10 < iVar15) {
            cVar2 = *is->current_;
            while ((byte)(cVar2 - 0x30U) < 10) {
              FileReadStream::Read(is);
              cVar2 = *is->current_;
            }
          }
          bVar8 = *is->current_;
        }
      }
      else {
        do {
          bVar8 = *is->current_;
          bVar14 = bVar8 - 0x30;
          if (9 < bVar14) goto LAB_00214915;
          FileReadStream::Read(is);
          iVar15 = iVar15 * 10 + (uint)bVar8 + -0x30;
        } while (iVar15 <= 0x134 - iVar18);
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                        ,0x678,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xd;
        *(byte **)(this + 0x38) = pbVar13;
LAB_00214915:
        if (bVar14 < 10) {
          bVar20 = false;
          goto LAB_00214941;
        }
      }
      iVar7 = -iVar15;
      if (!bVar20) {
        iVar7 = iVar15;
      }
      iVar15 = iVar7;
      bVar20 = true;
    }
    else {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                      ,0x67d,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      sVar4 = is->count_;
      pCVar5 = is->buffer_;
      *(undefined4 *)(this + 0x30) = 0xf;
      *(byte **)(this + 0x38) = pbVar3 + (sVar4 - (long)pCVar5);
      bVar20 = false;
      iVar15 = 0;
    }
LAB_00214941:
    if (!bVar20) {
      return;
    }
  }
  else {
    iVar15 = 0;
  }
  if (bVar6) {
    uVar17 = iVar15 + iVar18;
    if ((int)uVar17 < -0x134) {
      dVar25 = 0.0;
      if (-0x269 < (int)uVar17) {
        uVar17 = -uVar17 - 0x134;
        if (0x134 < uVar17) goto LAB_00214c6d;
        dVar24 = dVar24 / 1e+308;
LAB_00214ae0:
        dVar25 = dVar24 / *(double *)(internal::Pow10(int)::e + (ulong)uVar17 * 8);
      }
    }
    else {
      if ((int)uVar17 < 0) {
        uVar17 = -uVar17;
        if (0x134 < uVar17) goto LAB_00214c6d;
        goto LAB_00214ae0;
      }
      if (0x134 < uVar17) {
LAB_00214c6d:
        __assert_fail("n >= 0 && n <= 308",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/internal/pow10.h"
                      ,0x30,"double rapidjson::internal::Pow10(int)");
      }
      dVar25 = dVar24 * *(double *)(internal::Pow10(int)::e + (ulong)uVar17 * 8);
    }
    if (dVar25 <= 1.79769313486232e+308) {
      if (cVar1 == '-') {
        dVar25 = -dVar25;
      }
      pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar11->data_).n = (Number)0x0;
      (pGVar11->data_).s.str = (Ch *)0x0;
      *(double *)&pGVar11->data_ = dVar25;
      (pGVar11->data_).f.flags = 0x216;
      goto LAB_00214b57;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                    ,0x6ac,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0xd;
    *(byte **)(this + 0x38) = pbVar13;
    bVar6 = true;
    bVar9 = true;
  }
  else {
    if (bVar9) {
      if (cVar1 != '-') {
        pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar11->data_).n = (Number)0x0;
        (pGVar11->data_).s.str = (Ch *)0x0;
        *(ulong *)&pGVar11->data_ = uVar16;
        uVar12 = (ushort)((uVar16 & 0xffffffff80000000) == 0) * 0x20 +
                 ((ushort)(uVar16 >> 0x20 == 0) << 6 | (ushort)(-1 < (long)uVar16) << 7) + 0x116;
LAB_00214abf:
        (pGVar11->data_).f.flags = uVar12;
        goto LAB_00214b57;
      }
      bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int64(handler,-uVar16);
    }
    else {
      iVar15 = (int)uVar19;
      if (cVar1 != '-') {
        pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar11->data_).n = (Number)0x0;
        (pGVar11->data_).s.str = (Ch *)0x0;
        *(ulong *)&pGVar11->data_ = uVar19;
        uVar12 = (ushort)(-1 < iVar15) << 5 | 0x1d6;
        goto LAB_00214abf;
      }
      pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      uVar12 = 0xb6;
      if (iVar15 < 1) {
        uVar12 = 0x1f6;
      }
      (pGVar11->data_).n = (Number)0x0;
      (pGVar11->data_).s.str = (Ch *)0x0;
      *(long *)&pGVar11->data_ = (long)-iVar15;
      (pGVar11->data_).f.flags = uVar12;
LAB_00214b57:
      bVar9 = true;
    }
    bVar6 = false;
  }
  if (bVar6) {
    return;
  }
  if (bVar9 != false) {
    return;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                  ,0x6c4,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_00214b9a:
  *(byte **)(this + 0x38) = pbVar13;
  return;
LAB_00214494:
  bVar9 = true;
  uVar19 = uVar16;
  goto LAB_002144d7;
LAB_002145bc:
  auVar21._8_4_ = (int)(uVar16 >> 0x20);
  auVar21._0_8_ = uVar16;
  auVar21._12_4_ = 0x45300000;
  dVar24 = (auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
  bVar6 = true;
  goto LAB_002145f1;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }